

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O1

void __thiscall lunasvg::SVGMaskElement::applyMask(SVGMaskElement *this,SVGRenderState *state)

{
  Transform *this_00;
  SVGClipPathElement *this_01;
  SVGMaskElement *this_02;
  undefined8 this_03;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  float tx;
  float ty;
  float fVar2;
  float fVar3;
  shared_ptr<lunasvg::Canvas> maskImage;
  Transform currentTransform;
  undefined1 local_a8 [16];
  Transform local_98;
  float local_78;
  float fStack_74;
  SVGRenderState local_60;
  
  bVar1 = SVGRenderState::hasCycleReference(state,&this->super_SVGElement);
  if (!bVar1) {
    this_00 = &state->m_currentTransform;
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xd])();
    local_60._0_16_ = Transform::mapRect(this_00,(Rect *)&local_98);
    Canvas::create((Canvas *)local_a8,(Rect *)&local_60);
    this_03 = local_a8._0_8_;
    local_60._0_16_ = maskRect(this,state->m_element);
    fVar2 = local_60.m_parent._0_4_;
    fVar3 = local_60.m_parent._4_4_;
    Canvas::clipRect((Canvas *)this_03,(Rect *)&local_60,NonZero,this_00);
    local_98.m_matrix.e = (state->m_currentTransform).m_matrix.e;
    local_98.m_matrix.f = (state->m_currentTransform).m_matrix.f;
    local_98.m_matrix.a = (this_00->m_matrix).a;
    local_98.m_matrix.b = (state->m_currentTransform).m_matrix.b;
    local_98.m_matrix.c = (state->m_currentTransform).m_matrix.c;
    local_98.m_matrix.d = (state->m_currentTransform).m_matrix.d;
    if ((this->m_maskContentUnits).super_SVGProperty.field_0x9 == '\x01') {
      (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
      local_78 = fVar2;
      fStack_74 = fVar3;
      Transform::translate(&local_98,tx,ty);
      Transform::scale(&local_98,local_78,fStack_74);
    }
    if ((plutovg_canvas_t *)local_a8._8_8_ != (plutovg_canvas_t *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_a8._8_8_ + 8) = *(int *)(local_a8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_a8._8_8_ + 8) = *(int *)(local_a8._8_8_ + 8) + 1;
      }
    }
    local_60.m_parent = state;
    local_60.m_element = &this->super_SVGElement;
    local_60.m_currentTransform.m_matrix.b = local_98.m_matrix.b;
    local_60.m_currentTransform.m_matrix.a = local_98.m_matrix.a;
    local_60.m_currentTransform.m_matrix.d = local_98.m_matrix.d;
    local_60.m_currentTransform.m_matrix.c = local_98.m_matrix.c;
    local_60.m_currentTransform.m_matrix.e = local_98.m_matrix.e;
    local_60.m_currentTransform.m_matrix.f = local_98.m_matrix.f;
    local_60.m_mode = Painting;
    local_60.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a8._0_8_;
    local_60.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
    SVGElement::renderChildren(&this->super_SVGElement,&local_60);
    this_01 = (this->super_SVGElement).m_clipper;
    if (this_01 != (SVGClipPathElement *)0x0) {
      SVGClipPathElement::applyClipMask(this_01,&local_60);
    }
    this_02 = (this->super_SVGElement).m_masker;
    if (this_02 != (SVGMaskElement *)0x0) {
      applyMask(this_02,&local_60);
    }
    if (this->m_mask_type == Luminance) {
      Canvas::convertToLuminanceMask((Canvas *)local_a8._0_8_);
    }
    Canvas::blendCanvas((state->m_canvas).
                        super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (Canvas *)local_a8._0_8_,Dst_In,1.0);
    if ((plutovg_canvas_t *)
        local_60.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (plutovg_canvas_t *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((plutovg_canvas_t *)local_a8._8_8_ != (plutovg_canvas_t *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
  }
  return;
}

Assistant:

void SVGMaskElement::applyMask(SVGRenderState& state) const
{
    if(state.hasCycleReference(this))
        return;
    auto maskImage = Canvas::create(state.currentTransform().mapRect(state.paintBoundingBox()));
    maskImage->clipRect(maskRect(state.element()), FillRule::NonZero, state.currentTransform());

    auto currentTransform = state.currentTransform();
    if(m_maskContentUnits.value() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        currentTransform.translate(bbox.x, bbox.y);
        currentTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, currentTransform, SVGRenderMode::Painting, maskImage);
    renderChildren(newState);
    if(clipper())
        clipper()->applyClipMask(newState);
    if(masker()) {
        masker()->applyMask(newState);
    }

    if(m_mask_type == MaskType::Luminance)
        maskImage->convertToLuminanceMask();
    state->blendCanvas(*maskImage, BlendMode::Dst_In, 1.f);
}